

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRangeTestCase.cpp
# Opt level: O3

void __thiscall
SuiteTimeRangeTests::TestisInSameRange_UseLocalTime::~TestisInSameRange_UseLocalTime
          (TestisInSameRange_UseLocalTime *this)

{
  UnitTest::Test::~Test(&this->super_Test);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(isInSameRange_UseLocalTime)
{
  LocalTimeOnly start( 0, 0, 0 );
  LocalTimeOnly end( 1, 0, 0 );

  UtcTimeStamp time1 = UtcTimeStamp( 10, 0, 0, 10, 10, 2000 );
  UtcTimeStamp time2 = UtcTimeStamp( 11, 0, 0, 10, 10, 2000 );
  TimeRange timeRange(start, end, 1, 1);

  CHECK( timeRange.isInSameRange(time1, time2) );

}